

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::conttype<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool bVar1;
  string_view expected;
  undefined1 local_b0 [8];
  Result<wasm::Ok> x;
  string local_68 [32];
  undefined1 local_48 [8];
  Result<wasm::Ok> _val;
  
  expected._M_str = "cont";
  expected._M_len = 4;
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    typeidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_b0,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_48,
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_b0);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string(local_68,(string *)local_48);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 local_68);
      std::__cxx11::string::~string(local_68);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&x.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                   "expected end of cont type",(allocator<char> *)local_68);
        Lexer::err((Err *)local_48,&ctx->in,
                   (string *)
                   ((long)&x.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_48);
        std::__cxx11::string::~string((string *)local_48);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&x.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_b0);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ContinuationT> conttype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("cont"sv)) {
    return {};
  }

  auto x = typeidx(ctx);
  CHECK_ERR(x);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of cont type");
  }

  return ctx.makeContType(*x);
}